

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O2

MovInst __thiscall mocker::detail::MoveInfo::popWorklist(MoveInfo *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  MovInst MVar1;
  
  std::__shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)(in_RSI + 0xf0) + 8));
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::erase((_Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)(in_RSI + 0xe0),
          (const_iterator)
          ((_Node_iterator_base<std::shared_ptr<mocker::nasm::Mov>,_true> *)(in_RSI + 0xf0))->_M_cur
         );
  MVar1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MovInst)MVar1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MovInst MoveInfo::popWorklist() {
  auto res = *worklist.begin();
  worklist.erase(worklist.begin());
  return res;
}